

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall ON_BinaryArchive::ReadInt16(ON_BinaryArchive *this,size_t count,ON__INT16 *p)

{
  ON__INT16 OVar1;
  bool bVar2;
  ON__INT16 *pOStack_30;
  uchar c;
  uchar *b;
  bool rc;
  ON__INT16 *p_local;
  size_t count_local;
  ON_BinaryArchive *this_local;
  
  bVar2 = ReadByte(this,count << 1,p);
  if ((bVar2) && (pOStack_30 = p, p_local = (ON__INT16 *)count, this->m_endian == big_endian)) {
    while (p_local != (ON__INT16 *)0x0) {
      OVar1 = *pOStack_30;
      *(undefined1 *)pOStack_30 = *(undefined1 *)((long)pOStack_30 + 1);
      *(char *)((long)pOStack_30 + 1) = (char)OVar1;
      pOStack_30 = pOStack_30 + 1;
      p_local = (ON__INT16 *)((long)p_local + -1);
    }
  }
  return bVar2;
}

Assistant:

bool
ON_BinaryArchive::ReadInt16( // Read an array of 16 bit integers
		size_t count,            // number of unsigned integers to read
		ON__INT16* p
		)
{
  bool rc = ReadByte( count<<1, p );
  if (rc && m_endian == ON::endian::big_endian)
  {
    // reverse byte order
		unsigned char* b= (unsigned char*) (p);
		unsigned char  c;
		while(count--) {
			c = b[0]; b[0] = b[1]; b[1] = c;
			b += 2;
		}
  }
  return rc;
}